

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xreq.c
# Opt level: O0

int nn_xreq_recv(nn_sockbase *self,nn_msg *msg)

{
  uint uVar1;
  char *pcVar2;
  size_t sVar3;
  undefined4 *n;
  undefined4 *puVar4;
  nn_fq *in_RSI;
  nn_chunkref *in_RDI;
  int rc;
  undefined8 in_stack_ffffffffffffffc8;
  int errnum;
  nn_chunkref *in_stack_ffffffffffffffd0;
  FILE *__stream;
  nn_chunkref *pipe;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  int local_4;
  
  errnum = (int)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  pipe = in_RDI;
  if (in_RDI == (nn_chunkref *)0x0) {
    pipe = (nn_chunkref *)0x0;
  }
  uVar1 = nn_fq_recv(in_RSI,(nn_msg *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     (nn_pipe **)pipe);
  if (uVar1 == 0xfffffff5) {
    local_4 = -0xb;
  }
  else {
    if ((int)uVar1 < 0) {
      nn_backtrace_print();
      __stream = _stderr;
      pcVar2 = nn_err_strerror(errnum);
      fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar2,(ulong)-uVar1,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/xreq.c"
              ,0xb9);
      fflush(_stderr);
      nn_err_abort();
    }
    if ((uVar1 & 2) == 0) {
      sVar3 = nn_chunkref_size(in_stack_ffffffffffffffd0);
      if (sVar3 < 4) {
        nn_msg_term((nn_msg *)0x2f8c80);
        return -0xb;
      }
      sVar3 = nn_chunkref_size(in_stack_ffffffffffffffd0);
      if (sVar3 != 0) {
        nn_backtrace_print();
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_chunkref_size (&msg->sphdr) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/xreq.c"
                ,0xc4);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_chunkref_term(in_stack_ffffffffffffffd0);
      nn_chunkref_init(in_RDI,(size_t)in_RSI);
      n = (undefined4 *)nn_chunkref_data((nn_chunkref *)in_RSI);
      puVar4 = (undefined4 *)nn_chunkref_data((nn_chunkref *)&(in_RSI->priolist).slots[2].current);
      *n = *puVar4;
      nn_chunkref_trim(in_stack_ffffffffffffffd0,(size_t)n);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int nn_xreq_recv (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;

    rc = nn_fq_recv (&nn_cont (self, struct nn_xreq, sockbase)->fq, msg, NULL);
    if (rc == -EAGAIN)
        return -EAGAIN;
    errnum_assert (rc >= 0, -rc);

    if (!(rc & NN_PIPE_PARSED)) {

        /*  Ignore malformed replies. */
        if (nn_slow (nn_chunkref_size (&msg->body) < sizeof (uint32_t))) {
            nn_msg_term (msg);
            return -EAGAIN;
        }

        /*  Split the message into the header and the body. */
        nn_assert (nn_chunkref_size (&msg->sphdr) == 0);
        nn_chunkref_term (&msg->sphdr);
        nn_chunkref_init (&msg->sphdr, sizeof (uint32_t));
        memcpy (nn_chunkref_data (&msg->sphdr), nn_chunkref_data (&msg->body),
            sizeof (uint32_t));
        nn_chunkref_trim (&msg->body, sizeof (uint32_t));
    }

    return 0;
}